

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::DecimalTypeInfo::Deserialize(DecimalTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  DecimalTypeInfo *pDVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  shared_ptr<duckdb::DecimalTypeInfo,_true> result;
  
  pDVar2 = (DecimalTypeInfo *)operator_new(0x40);
  DecimalTypeInfo(pDVar2);
  ::std::__shared_ptr<duckdb::DecimalTypeInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::DecimalTypeInfo,void>
            ((__shared_ptr<duckdb::DecimalTypeInfo,(__gnu_cxx::_Lock_policy)2> *)&result,pDVar2);
  pDVar2 = shared_ptr<duckdb::DecimalTypeInfo,_true>::operator->(&result);
  Deserializer::ReadPropertyWithDefault<unsigned_char>(deserializer,200,"width",&pDVar2->width);
  pDVar2 = shared_ptr<duckdb::DecimalTypeInfo,_true>::operator->(&result);
  Deserializer::ReadPropertyWithDefault<unsigned_char>(deserializer,0xc9,"scale",&pDVar2->scale);
  _Var1 = result.internal.super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  result.internal.super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       result.internal.super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  result.internal.super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result.internal.
              super___shared_ptr<duckdb::DecimalTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> DecimalTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<DecimalTypeInfo>(new DecimalTypeInfo());
	deserializer.ReadPropertyWithDefault<uint8_t>(200, "width", result->width);
	deserializer.ReadPropertyWithDefault<uint8_t>(201, "scale", result->scale);
	return std::move(result);
}